

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::add_collapsed_var(Codegen *this,VarId *tgt,VarId *item)

{
  VarId item_src;
  VarId tgt_src;
  undefined1 local_50 [48];
  
  local_50._16_8_ = &PTR_display_001d90d0;
  local_50._24_4_ = tgt->id;
  get_collapsed_var((Codegen *)(local_50 + 0x20),(VarId *)this);
  get_collapsed_var((Codegen *)local_50,(VarId *)this);
  std::
  unordered_map<mir::inst::VarId,mir::inst::VarId,std::hash<mir::inst::VarId>,std::equal_to<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  ::insert_or_assign<mir::inst::VarId&>
            ((unordered_map<mir::inst::VarId,mir::inst::VarId,std::hash<mir::inst::VarId>,std::equal_to<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
              *)&this->var_collapse,(key_type *)local_50,(VarId *)(local_50 + 0x20));
  return;
}

Assistant:

void Codegen::add_collapsed_var(mir::inst::VarId tgt, mir::inst::VarId item) {
  auto tgt_src = get_collapsed_var(tgt);
  auto item_src = get_collapsed_var(item);

  var_collapse.insert_or_assign(item_src, tgt_src);
}